

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O1

bool IsOperaSoftTrack(Track *track)

{
  pointer pSVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Sector *s;
  pointer pSVar5;
  Track *__range1;
  long lVar6;
  bool bVar7;
  
  iVar3 = Track::size(track);
  if (iVar3 == 9) {
    pSVar5 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar4 = 0;
    bVar7 = pSVar5 == pSVar1;
    if (!bVar7) {
      iVar3 = 0;
      do {
        bVar2 = false;
        if ((pSVar5->datarate == _250K) && (bVar2 = false, pSVar5->encoding == MFM)) {
          lVar6 = (long)iVar3;
          iVar3 = iVar3 + 1;
          if ((pSVar5->header).size == (uint)"\x01\x01\x01\x01\x01\x01\x01\x01\b"[lVar6]) {
            uVar4 = uVar4 | 1 << ((byte)(pSVar5->header).sector & 0x1f);
            bVar2 = true;
          }
          else {
            bVar2 = false;
          }
        }
        if (!bVar2) break;
        pSVar5 = pSVar5 + 1;
        bVar7 = pSVar5 == pSVar1;
      } while (!bVar7);
      if (!bVar7) {
        return false;
      }
      if (uVar4 != 0x1ff) {
        return false;
      }
      if (opt.debug == 0) {
        return true;
      }
      util::operator<<((LogHelper *)&util::cout,
                       (char (*) [42])"detected OperaSoft track with 32K sector\n");
      return true;
    }
  }
  return false;
}

Assistant:

bool IsOperaSoftTrack(const Track& track)
{
    uint32_t sector_mask = 0;
    int i = 0;

    if (track.size() != 9)
        return false;

    for (auto& s : track)
    {
        if (s.datarate != DataRate::_250K || s.encoding != Encoding::MFM)
            return false;

        static const uint8_t sizes[] = { 1,1,1,1,1,1,1,1,8 };
        if (s.header.size != sizes[i++])
            return false;

        sector_mask |= (1 << s.header.sector);
    }

    // Sectors must be numbered 0 to 8
    if (sector_mask != ((1 << 9) - 1))
        return false;

    if (opt.debug) util::cout << "detected OperaSoft track with 32K sector\n";
    return true;
}